

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  byte in_DIL;
  bool term_supports_color;
  char *term;
  char *gtest_color;
  char *in_stack_ffffffffffffffd8;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_1;
  
  std::__cxx11::string::c_str();
  bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffffd8,(char *)0x1aef7f);
  if (bVar1) {
    posix::GetEnv((char *)0x1aef94);
    bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1aefaa);
    local_1a = true;
    if (!bVar1) {
      bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1aefcc);
      local_1a = true;
      if (!bVar1) {
        bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1aefee);
        local_1a = true;
        if (!bVar1) {
          bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af010);
          local_1a = true;
          if (!bVar1) {
            bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af032);
            local_1a = true;
            if (!bVar1) {
              bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af054);
              local_1a = true;
              if (!bVar1) {
                bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af076);
                local_1a = true;
                if (!bVar1) {
                  bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af094);
                  local_1a = true;
                  if (!bVar1) {
                    bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af0b2);
                    local_1a = true;
                    if (!bVar1) {
                      bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af0d0);
                      local_1a = true;
                      if (!bVar1) {
                        local_1a = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af0ee)
                        ;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_1b = false;
    if ((in_DIL & 1) != 0) {
      local_1b = local_1a;
    }
    local_1 = local_1b;
  }
  else {
    bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af12e);
    local_1c = true;
    if (!bVar1) {
      bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af14c);
      local_1c = true;
      if (!bVar1) {
        bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af16a);
        local_1c = true;
        if (!bVar1) {
          local_1c = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x1af188);
        }
      }
    }
    local_1 = local_1c;
  }
  return local_1;
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  const char* const gtest_color = GTEST_FLAG(color).c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MINGW
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        String::CStringEquals(term, "xterm") ||
        String::CStringEquals(term, "xterm-color") ||
        String::CStringEquals(term, "xterm-256color") ||
        String::CStringEquals(term, "screen") ||
        String::CStringEquals(term, "screen-256color") ||
        String::CStringEquals(term, "tmux") ||
        String::CStringEquals(term, "tmux-256color") ||
        String::CStringEquals(term, "rxvt-unicode") ||
        String::CStringEquals(term, "rxvt-unicode-256color") ||
        String::CStringEquals(term, "linux") ||
        String::CStringEquals(term, "cygwin");
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
      String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}